

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void Unserialize<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>,CAddress,std::allocator<CAddress>>
               (ParamsStream<HashVerifier<AutoFile>_&,_CAddress::SerParams> *is,
               vector<CAddress,_std::allocator<CAddress>_> *v)

{
  long in_FS_OFFSET;
  vector<CAddress,_std::allocator<CAddress>_> *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = v;
  Wrapper<VectorFormatter<DefaultFormatter>,std::vector<CAddress,std::allocator<CAddress>>&>::
  Unserialize<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>>
            ((Wrapper<VectorFormatter<DefaultFormatter>,std::vector<CAddress,std::allocator<CAddress>>&>
              *)&local_10,is);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& is, std::vector<T, A>& v)
{
    if constexpr (BasicByte<T>) { // Use optimized version for unformatted basic bytes
        // Limit size per read so bogus size value won't cause out of memory
        v.clear();
        unsigned int nSize = ReadCompactSize(is);
        unsigned int i = 0;
        while (i < nSize) {
            unsigned int blk = std::min(nSize - i, (unsigned int)(1 + 4999999 / sizeof(T)));
            v.resize(i + blk);
            is.read(AsWritableBytes(Span{&v[i], blk}));
            i += blk;
        }
    } else {
        Unserialize(is, Using<VectorFormatter<DefaultFormatter>>(v));
    }
}